

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_camellia.c
# Opt level: O0

void * camellia_dupctx(void *ctx)

{
  int iVar1;
  char *in_RDI;
  PROV_CAMELLIA_CTX *ret;
  PROV_CAMELLIA_CTX *in;
  char *file;
  char *local_8;
  
  file = in_RDI;
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    local_8 = (char *)0x0;
  }
  else {
    local_8 = (char *)CRYPTO_malloc(0x1d8,"providers/implementations/ciphers/cipher_camellia.c",0x29
                                   );
    if (local_8 == (char *)0x0) {
      ERR_new();
      ERR_set_debug(file,(int)((ulong)in_RDI >> 0x20),local_8);
      ERR_set_error(0x39,0xc0100,(char *)0x0);
      local_8 = (char *)0x0;
    }
    else {
      (**(code **)(*(long *)(in_RDI + 0xa8) + 0x10))(local_8,in_RDI);
    }
  }
  return local_8;
}

Assistant:

static void *camellia_dupctx(void *ctx)
{
    PROV_CAMELLIA_CTX *in = (PROV_CAMELLIA_CTX *)ctx;
    PROV_CAMELLIA_CTX *ret;

    if (!ossl_prov_is_running())
        return NULL;

    ret = OPENSSL_malloc(sizeof(*ret));
    if (ret == NULL) {
        ERR_raise(ERR_LIB_PROV, ERR_R_MALLOC_FAILURE);
        return NULL;
    }
    in->base.hw->copyctx(&ret->base, &in->base);

    return ret;
}